

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::anon_unknown_1::almostEqualUlps<double>(double lhs,double rhs,uint64_t maxUlpDiff)

{
  ulong uVar1;
  uint uVar2;
  int64_t iVar3;
  int64_t iVar4;
  int in_EDI;
  undefined4 in_register_0000003c;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double ulpDiff;
  int64_t rc;
  int64_t lc;
  
  uVar1 = CONCAT44(in_register_0000003c,in_EDI);
  uVar2 = isnan(in_XMM0_Qa);
  if (((uVar2 & 1) == 0) && (uVar2 = isnan(in_XMM1_Qa), (uVar2 & 1) == 0)) {
    iVar3 = convert(in_XMM0_Qa);
    iVar4 = convert(in_XMM1_Qa);
    if (iVar3 < 0 != iVar4 < 0) {
      return in_XMM0_Qa == in_XMM1_Qa;
    }
    clara::std::abs(in_EDI);
    return (ulong)((long)extraout_XMM0_Qa |
                  (long)(extraout_XMM0_Qa - 9.223372036854776e+18) & (long)extraout_XMM0_Qa >> 0x3f)
           <= uVar1;
  }
  return false;
}

Assistant:

bool almostEqualUlps(FP lhs, FP rhs, uint64_t maxUlpDiff) {
        // Comparison with NaN should always be false.
        // This way we can rule it out before getting into the ugly details
        if (Catch::isnan(lhs) || Catch::isnan(rhs)) {
            return false;
        }

        auto lc = convert(lhs);
        auto rc = convert(rhs);

        if ((lc < 0) != (rc < 0)) {
            // Potentially we can have +0 and -0
            return lhs == rhs;
        }

        // static cast as a workaround for IBM XLC
        auto ulpDiff = std::abs(static_cast<FP>(lc - rc));
        return static_cast<uint64_t>(ulpDiff) <= maxUlpDiff;
    }